

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackDebGenerator::PackageComponentsAllInOne(cmCPackDebGenerator *this,string *compInstDirName)

{
  char *pcVar1;
  cmCPackLog *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  char *__s;
  long *plVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  size_type *psVar10;
  string outputFileName;
  string packageFileName;
  Glob gl;
  string localToplevel;
  ostringstream cmCPackLog_msg;
  string findExpr;
  string initialTopLevel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  undefined1 local_288 [81];
  bool local_237;
  long *local_230 [2];
  long local_220 [2];
  undefined1 local_210 [112];
  ios_base local_1a0 [264];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pvVar9 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(pvVar9,(this->super_cmCPackGenerator).packageFileNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  pcVar1 = local_210 + 0x10;
  local_210._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar6,(allocator<char> *)local_288);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_210,
             "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
             ,0x5b);
  std::ios::widen((char)(ostream *)local_210 + (char)*(undefined8 *)(local_210._0_8_ + -0x18));
  std::ostream::put((char)local_210);
  std::ostream::flush();
  pcVar2 = (this->super_cmCPackGenerator).Logger;
  local_98 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar9;
  std::__cxx11::stringbuf::str();
  uVar3 = local_288._0_8_;
  sVar7 = strlen((char *)local_288._0_8_);
  cmCPackLog::Log(pcVar2,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x24e,(char *)uVar3,sVar7);
  pcVar6 = local_288 + 0x10;
  if ((char *)local_288._0_8_ != pcVar6) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
  std::ios_base::~ios_base(local_1a0);
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char*>((string *)local_230,local_50,local_48 + (long)local_50);
  cmsys::SystemTools::GetParentDirectory(&local_2a8,&(this->super_cmCPackGenerator).toplevel);
  local_288._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"CPACK_PACKAGE_FILE_NAME","");
  __s = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,__s,(allocator<char> *)&local_90);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  plVar8 = (long *)std::__cxx11::string::append(local_210);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2c8.field_2._M_allocated_capacity = *psVar10;
    local_2c8.field_2._8_8_ = plVar8[3];
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *psVar10;
    local_2c8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2c8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((char *)local_288._0_8_ != pcVar6) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  if (compInstDirName->_M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   "/",compInstDirName);
    std::__cxx11::string::_M_append((char *)local_230,local_210._0_8_);
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
  }
  local_210._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_210,(char *)local_230[0]);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,"/",
                 &local_2c8);
  std::__cxx11::string::_M_append((char *)&local_2a8,local_210._0_8_);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_210._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_210,local_2c8._M_dataplus._M_p);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  local_210._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_210,local_2a8._M_dataplus._M_p);
  if ((char *)local_210._0_8_ != pcVar1) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if (compInstDirName->_M_string_length != 0) {
    local_210._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"/","");
    std::__cxx11::string::_M_append(local_210,(ulong)(compInstDirName->_M_dataplus)._M_p);
    local_288._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH","");
    cmCPackGenerator::SetOption
              (&this->super_cmCPackGenerator,(string *)local_288,(char *)local_210._0_8_);
    if ((char *)local_288._0_8_ != pcVar6) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
  }
  bVar4 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar4) {
    cmsys::Glob::Glob((Glob *)local_288);
    local_210._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"GEN_WDIR","");
    pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar6,(allocator<char> *)local_70);
    if ((char *)local_210._0_8_ != pcVar1) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    std::__cxx11::string::append((char *)&local_90);
    local_288[8] = true;
    local_237 = true;
    bVar4 = cmsys::Glob::FindFiles((Glob *)local_288,&local_90,(GlobMessages *)0x0);
    if (bVar4) {
      pvVar9 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_288);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->packageFiles,pvVar9);
      iVar5 = createDeb(this);
      local_210._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"CPACK_TOPLEVEL_DIRECTORY","");
      pcVar6 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_210);
      strlen(pcVar6);
      std::__cxx11::string::_M_replace
                ((ulong)&local_2a8,0,(char *)local_2a8._M_string_length,(ulong)pcVar6);
      if ((char *)local_210._0_8_ != pcVar1) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      std::__cxx11::string::append((char *)&local_2a8);
      local_210._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"GEN_CPACK_OUTPUT_FILE_NAME","");
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)local_210);
      std::__cxx11::string::append((char *)&local_2a8);
      if ((char *)local_210._0_8_ != pcVar1) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_98,&local_2a8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_210,"Cannot find any files in the installed directory",0x30);
      std::ios::widen((char)(ostream *)local_210 + (char)*(undefined8 *)(local_210._0_8_ + -0x18));
      std::ostream::put((char)local_210);
      std::ostream::flush();
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      plVar8 = local_70[0];
      sVar7 = strlen((char *)local_70[0]);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x27c,(char *)plVar8,sVar7);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
      std::ios_base::~ios_base(local_1a0);
      iVar5 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    cmsys::Glob::~Glob((Glob *)local_288);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_210,"Error while execution CPackDeb.cmake",0x24);
    std::ios::widen((char)(ostream *)local_210 + (char)*(undefined8 *)(local_210._0_8_ + -0x18));
    std::ostream::put((char)local_210);
    std::ostream::flush();
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    uVar3 = local_288._0_8_;
    sVar7 = strlen((char *)local_288._0_8_);
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x26f,(char *)uVar3,sVar7);
    if ((char *)local_288._0_8_ != pcVar6) {
      operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
    std::ios_base::~ios_base(local_1a0);
    iVar5 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return iVar5;
}

Assistant:

int cmCPackDebGenerator::PackageComponentsAllInOne(
  const std::string& compInstDirName)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                  << std::endl);

  // The ALL GROUPS in ONE package case
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(cmSystemTools::GetParentDirectory(toplevel));
  std::string outputFileName(
    std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME")) +
    this->GetOutputExtension());
  // all GROUP in one vs all COMPONENT in one
  // if must be here otherwise non component paths have a trailing / while
  // components don't
  if (!compInstDirName.empty()) {
    localToplevel += "/" + compInstDirName;
  }

  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel.c_str());
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());

  if (!compInstDirName.empty()) {
    // Tell CPackDeb.cmake the path where the component is.
    std::string component_path = "/";
    component_path += compInstDirName;
    this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",
                    component_path.c_str());
  }
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    retval = 0;
    return retval;
  }

  cmsys::Glob gl;
  std::string findExpr(this->GetOption("GEN_WDIR"));
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the installed directory"
                    << std::endl);
    return 0;
  }
  packageFiles = gl.GetFiles();

  int res = createDeb();
  if (res != 1) {
    retval = 0;
  }
  // add the generated package to package file names list
  packageFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  packageFileName += "/";
  packageFileName += this->GetOption("GEN_CPACK_OUTPUT_FILE_NAME");
  packageFileNames.push_back(std::move(packageFileName));
  return retval;
}